

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_impl.h
# Opt level: O2

void __thiscall AddrInfo::AddrInfo(AddrInfo *this,CAddress *addrIn,CNetAddr *addrSource)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CAddress::CAddress(&this->super_CAddress,addrIn);
  (this->m_last_try).__d.__r = 0;
  (this->m_last_count_attempt).__d.__r = 0;
  CNetAddr::CNetAddr(&this->source,addrSource);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->m_last_success).__d.__r = 0;
    this->nAttempts = 0;
    this->nRefCount = 0;
    this->fInTried = false;
    this->nRandomPos = -1;
    return;
  }
  __stack_chk_fail();
}

Assistant:

AddrInfo(const CAddress &addrIn, const CNetAddr &addrSource) : CAddress(addrIn), source(addrSource)
    {
    }